

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinvchar.cpp
# Opt level: O3

UBool uprv_isInvariantString_63(char *s,int32_t length)

{
  byte bVar1;
  byte *pbVar2;
  
LAB_002ace53:
  do {
    pbVar2 = (byte *)s;
    if (length < 0) {
      bVar1 = *pbVar2;
      if (bVar1 == 0) {
        return '\x01';
      }
    }
    else {
      if (length == 0) {
        return '\x01';
      }
      length = length + -1;
      bVar1 = *pbVar2;
      s = (char *)(pbVar2 + 1);
      if (bVar1 == 0) goto LAB_002ace53;
    }
    if (((char)bVar1 < '\0') ||
       (s = (char *)(pbVar2 + 1),
       (*(uint *)((long)invariantChars + (ulong)(bVar1 >> 3 & 0x1c)) >> (bVar1 & 0x1f) & 1) == 0)) {
      return '\0';
    }
  } while( true );
}

Assistant:

U_CAPI UBool U_EXPORT2
uprv_isInvariantString(const char *s, int32_t length) {
    uint8_t c;

    for(;;) {
        if(length<0) {
            /* NUL-terminated */
            c=(uint8_t)*s++;
            if(c==0) {
                break;
            }
        } else {
            /* count length */
            if(length==0) {
                break;
            }
            --length;
            c=(uint8_t)*s++;
            if(c==0) {
                continue; /* NUL is invariant */
            }
        }
        /* c!=0 now, one branch below checks c==0 for variant characters */

        /*
         * no assertions here because these functions are legitimately called
         * for strings with variant characters
         */
#if U_CHARSET_FAMILY==U_ASCII_FAMILY
        if(!UCHAR_IS_INVARIANT(c)) {
            return FALSE; /* found a variant char */
        }
#elif U_CHARSET_FAMILY==U_EBCDIC_FAMILY
        c=CHAR_TO_UCHAR(c);
        if(c==0 || !UCHAR_IS_INVARIANT(c)) {
            return FALSE; /* found a variant char */
        }
#else
#   error U_CHARSET_FAMILY is not valid
#endif
    }
    return TRUE;
}